

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::remove_web_seed_conn(torrent *this,peer_connection *p)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *plVar1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  bool in;
  _List_node_base *p_Var2;
  iterator __position;
  undefined8 uStack_30;
  system_error_category *psStack_28;
  
  plVar1 = &this->m_web_seeds;
  __position._M_node =
       (this->m_web_seeds).
       super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  if (__position._M_node != (_List_node_base *)plVar1) {
    p_Var2 = (_List_node_base *)&p->super_peer_connection_interface;
    if (p == (peer_connection *)0x0) {
      p_Var2 = (_List_node_base *)0x0;
    }
    do {
      if (p_Var2 == __position._M_node[9]._M_next) break;
      __position._M_node = (__position._M_node)->_M_next;
    } while (__position._M_node != (_List_node_base *)plVar1);
  }
  if (__position._M_node == (_List_node_base *)plVar1) {
    return;
  }
  if (*(char *)((long)&__position._M_node[0xb]._M_next + 1) == '\x01') {
    *(undefined1 *)((long)&__position._M_node[0xb]._M_next + 2) = 1;
  }
  else {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"removing web seed: \"%s\"",__position._M_node[1]._M_next);
    p_Var2 = __position._M_node[9]._M_next;
    if (p_Var2 != (_List_node_base *)0x0) {
      uStack_30 = 0x10000007d;
      psStack_28 = &boost::system::detail::cat_holder<void>::system_category_instance;
      (*(code *)p_Var2[-8]._M_next[10]._M_next)(p_Var2 + -8,&uStack_30,1,0);
      (*(code *)p_Var2[-8]._M_next[3]._M_next)(p_Var2 + -8,0);
    }
    this_00._M_head_impl =
         (this->super_torrent_hot_members).m_picker._M_t.
         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
    if (this_00._M_head_impl != (piece_picker *)0x0) {
      piece_picker::clear_peer(this_00._M_head_impl,(torrent_peer *)&__position._M_node[8]._M_prev);
    }
    ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
    ::_M_erase(&this->m_web_seeds,__position);
  }
  in = want_tick(this);
  update_list(this,(torrent_list_index_t)0x1,in);
  return;
}

Assistant:

void torrent::remove_web_seed_conn(peer_connection* p)
	{
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [p] (web_seed_t const& ws) { return ws.peer_info.connection == p; });

		TORRENT_ASSERT(i != m_web_seeds.end());
		if (i == m_web_seeds.end()) return;
		remove_web_seed_iter(i);
	}